

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  long lVar2;
  OneofDescriptor *oneof_descriptor;
  size_t sVar3;
  undefined8 uVar4;
  bool bVar5;
  FieldDescriptor FVar6;
  bool bVar7;
  int iVar8;
  CppType CVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar10;
  undefined4 extraout_var_02;
  FieldDescriptor *pFVar11;
  undefined4 extraout_var_03;
  long *plVar12;
  Descriptor *pDVar13;
  undefined8 *puVar14;
  Descriptor *pDVar15;
  ReservedRange *pRVar16;
  FieldDescriptor *pFVar17;
  MessageFactory *factory;
  LogMessage *other;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  MessageLite *this_00;
  AlphaNum *b;
  size_type *psVar19;
  Reflection *extraout_RDX;
  char *pcVar20;
  code *pcVar21;
  ulong uVar22;
  code *pcVar23;
  ulong uVar24;
  ParseLocationRange range;
  string serialized_value;
  string full_type_name;
  string prefix;
  string field_name;
  string prefix_and_full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  Reflection *local_178;
  Tokenizer *local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [48];
  Message *local_118;
  string local_110;
  undefined1 local_f0 [32];
  string local_d0;
  ParseLocation local_b0;
  FieldDescriptor *local_a8;
  FieldDescriptor *local_a0;
  Descriptor *local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  undefined4 extraout_var_04;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  local_178 = extraout_RDX;
  iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  pDVar13 = (Descriptor *)CONCAT44(extraout_var,iVar8);
  local_f0._0_8_ = local_f0 + 0x10;
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_b0.line = (this->tokenizer_).current_.line;
  local_b0.column = (this->tokenizer_).current_.column;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_a0,&local_a8);
  b = (AlphaNum *)&this->tokenizer_;
  pcVar21 = (code *)(local_1b0 + 0x10);
  local_170 = (Tokenizer *)b;
  if (bVar5) {
    local_1b0._0_8_ = pcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[","");
    bVar5 = TryConsume(this,(string *)local_1b0);
    if ((code *)local_1b0._0_8_ != pcVar21) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if (bVar5) {
      local_168._8_8_ = 0;
      local_158._M_allocated_capacity = local_158._M_allocated_capacity & 0xffffffffffffff00;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      local_168._0_8_ = (FieldDescriptor *)(local_168 + 0x10);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      bVar5 = ConsumeAnyTypeUrl(this,(string *)local_168,&local_110);
      if (bVar5) {
        local_1b0._0_8_ = local_110._M_dataplus._M_p;
        local_1b0._8_8_ = local_110._M_string_length;
        local_148._0_8_ = local_168._0_8_;
        local_148._8_8_ = local_168._8_8_;
        StrCat_abi_cxx11_(&local_d0,(protobuf *)local_1b0,(AlphaNum *)local_148,b);
        local_1b0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"]","");
        bVar5 = ConsumeBeforeWhitespace(this,(string *)local_1b0);
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if (bVar5) {
          if ((local_170->current_).type == TYPE_WHITESPACE) {
            io::Tokenizer::Next(local_170);
          }
          local_1b0._0_8_ = pcVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,":","");
          TryConsumeBeforeWhitespace(this,(string *)local_1b0);
          if ((code *)local_1b0._0_8_ != pcVar21) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if ((local_170->current_).type == TYPE_WHITESPACE) {
            io::Tokenizer::Next(local_170);
          }
          local_1b0._8_8_ = (char *)0x0;
          local_1a0[0]._M_allocated_capacity =
               local_1a0[0]._M_allocated_capacity & 0xffffffffffffff00;
          pFVar1 = this->finder_;
          if (pFVar1 == (Finder *)0x0) {
            local_1b0._0_8_ = pcVar21;
            local_118 = message;
            pDVar13 = anon_unknown_19::DefaultFinderFindAnyType
                                (message,&local_110,(string *)local_168);
          }
          else {
            local_1b0._0_8_ = pcVar21;
            local_118 = message;
            iVar8 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&local_110,local_168);
            pDVar13 = (Descriptor *)CONCAT44(extraout_var_00,iVar8);
          }
          if (pDVar13 == (Descriptor *)0x0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90,"Could not find type \"",&local_d0);
            puVar14 = (undefined8 *)std::__cxx11::string::append(local_90);
            pFVar17 = (FieldDescriptor *)(puVar14 + 2);
            if ((FieldDescriptor *)*puVar14 == pFVar17) {
              local_148._16_8_ = *(undefined8 *)pFVar17;
              local_148._24_8_ = puVar14[3];
              local_148._0_8_ = (FieldDescriptor *)(local_148 + 0x10);
            }
            else {
              local_148._16_8_ = *(undefined8 *)pFVar17;
              local_148._0_8_ = (FieldDescriptor *)*puVar14;
            }
            local_148._8_8_ = puVar14[1];
            *puVar14 = pFVar17;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_148);
            if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            if ((FieldDescriptor *)local_90._0_8_ != (FieldDescriptor *)(local_90 + 0x10)) {
LAB_003b3b98:
              operator_delete((void *)local_90._0_8_);
            }
LAB_003b3b9d:
            bVar5 = false;
          }
          else {
            bVar5 = ConsumeAnyValue(this,pDVar13,(string *)local_1b0);
            if (!bVar5) goto LAB_003b3b9d;
            if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
               ((((~(byte)local_a0[1] & 0x60) != 0 &&
                 (bVar5 = Reflection::HasField(local_178,local_118,local_a0), bVar5)) ||
                (((~(byte)local_a8[1] & 0x60) != 0 &&
                 (bVar5 = Reflection::HasField(local_178,local_118,local_a8), bVar5)))))) {
              local_148._0_8_ = (FieldDescriptor *)(local_148 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_148,"Non-repeated Any specified multiple times.","");
              ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          (string *)local_148);
              local_90._0_8_ = local_148._0_8_;
              if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10))
              goto LAB_003b3b98;
              goto LAB_003b3b9d;
            }
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_d0._M_dataplus._M_p,
                       local_d0._M_dataplus._M_p + local_d0._M_string_length);
            Reflection::SetString(local_178,local_118,local_a0,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_1b0._0_8_,
                       (char *)(local_1b0._8_8_ + local_1b0._0_8_));
            Reflection::SetString(local_178,local_118,local_a8,&local_70);
            bVar5 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          if ((code *)local_1b0._0_8_ != pcVar21) {
            operator_delete((void *)local_1b0._0_8_);
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_168._0_8_ != (FieldDescriptor *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_);
      }
      goto LAB_003b41d4;
    }
  }
  local_1b0._0_8_ = pcVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[","");
  bVar5 = TryConsume(this,(string *)local_1b0);
  if ((code *)local_1b0._0_8_ != pcVar21) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,(string *)local_f0);
    if (bVar5) {
      local_1b0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"]","");
      bVar5 = ConsumeBeforeWhitespace(this,(string *)local_1b0);
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (bVar5) {
        (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1b0,message);
        if ((local_170->current_).type == TYPE_WHITESPACE) {
          io::Tokenizer::Next(local_170);
        }
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
          pFVar17 = DescriptorPool::FindExtensionByPrintableName
                              (*(DescriptorPool **)
                                (*(long *)((Descriptor *)CONCAT44(extraout_var_03,iVar8) + 0x10) +
                                0x10),(Descriptor *)CONCAT44(extraout_var_03,iVar8),
                               (ConstStringParam)local_f0);
        }
        else {
          iVar8 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,local_f0);
          pFVar17 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar8);
        }
        if (pFVar17 != (FieldDescriptor *)0x0) goto LAB_003b34f7;
        if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
          std::operator+(&local_110,"Extension \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_168._0_8_ = local_168 + 0x10;
          pFVar17 = (FieldDescriptor *)(puVar14 + 2);
          if ((FieldDescriptor *)*puVar14 == pFVar17) {
            local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
            local_158._8_8_ = puVar14[3];
          }
          else {
            local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
            local_168._0_8_ = (FieldDescriptor *)*puVar14;
          }
          local_168._8_8_ = puVar14[1];
          *puVar14 = pFVar17;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(pDVar13 + 8) + 0x20));
          puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
          pcVar23 = (code *)(puVar14 + 2);
          if ((code *)*puVar14 == pcVar23) {
            local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
            local_1a0[0]._8_8_ = puVar14[3];
            local_1b0._0_8_ = pcVar21;
          }
          else {
            local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
            local_1b0._0_8_ = (code *)*puVar14;
          }
          local_1b0._8_8_ = puVar14[1];
          *puVar14 = pcVar23;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1b0);
          goto LAB_003b4187;
        }
        std::operator+(&local_110,"Ignoring extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_168._0_8_ = local_168 + 0x10;
        pFVar17 = (FieldDescriptor *)(plVar12 + 2);
        if ((FieldDescriptor *)*plVar12 == pFVar17) {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_158._8_8_ = plVar12[3];
        }
        else {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_168._0_8_ = (FieldDescriptor *)*plVar12;
        }
        local_168._8_8_ = plVar12[1];
        *plVar12 = (long)pFVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(pDVar13 + 8) + 0x20));
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
        pcVar23 = (code *)(puVar14 + 2);
        if ((code *)*puVar14 == pcVar23) {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
          local_1a0[0]._8_8_ = puVar14[3];
          local_1b0._0_8_ = pcVar21;
        }
        else {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
          local_1b0._0_8_ = (code *)*puVar14;
        }
        local_1b0._8_8_ = puVar14[1];
        *puVar14 = pcVar23;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1b0);
LAB_003b3d48:
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_);
        }
        if ((FieldDescriptor *)local_168._0_8_ != (FieldDescriptor *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        bVar7 = false;
LAB_003b3d94:
        pcVar21 = (code *)(local_1b0 + 0x10);
        if (((*(bool *)((long)this + 0xf5) == false) && (!bVar7)) &&
           ((*(bool *)((long)this + 0xf6) & 1U) == 0)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_1b0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                     ,0x221);
          other = internal::LogMessage::operator<<
                            ((LogMessage *)local_1b0,
                             "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                            );
          internal::LogFinisher::operator=((LogFinisher *)local_148,other);
          internal::LogMessage::~LogMessage((LogMessage *)local_1b0);
        }
        local_1b0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,":","");
        bVar5 = TryConsumeBeforeWhitespace(this,(string *)local_1b0);
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if (bVar5) {
          (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1b0,message);
          if ((local_170->current_).type == TYPE_WHITESPACE) {
            io::Tokenizer::Next(local_170);
          }
          if ((code *)local_1b0._0_8_ != pcVar21) {
            operator_delete((void *)local_1b0._0_8_);
          }
          local_1b0._0_8_ = pcVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"{","");
          pcVar23 = (code *)local_1b0._0_8_;
          pcVar20 = *(char **)((long)this + 0x38);
          if ((pcVar20 == (char *)local_1b0._8_8_) &&
             ((pcVar20 == (char *)0x0 ||
              (iVar8 = bcmp((((string *)((long)this + 0x30))->_M_dataplus)._M_p,
                            (void *)local_1b0._0_8_,(size_t)pcVar20), iVar8 == 0)))) {
            bVar5 = false;
          }
          else {
            local_148._0_8_ = (FieldDescriptor *)(local_148 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"<","");
            uVar4 = local_148._0_8_;
            sVar3 = *(size_type *)((long)this + 0x38);
            if (sVar3 == local_148._8_8_) {
              if (sVar3 == 0) {
                bVar5 = false;
              }
              else {
                iVar8 = bcmp((((string *)((long)this + 0x30))->_M_dataplus)._M_p,
                             (void *)local_148._0_8_,sVar3);
                bVar5 = iVar8 != 0;
              }
            }
            else {
              bVar5 = true;
            }
            pcVar23 = (code *)local_1b0._0_8_;
            if ((FieldDescriptor *)uVar4 != (FieldDescriptor *)(local_148 + 0x10)) {
              operator_delete((void *)uVar4);
              pcVar23 = (code *)local_1b0._0_8_;
            }
          }
          if (pcVar23 != pcVar21) {
            operator_delete(pcVar23);
          }
          if (bVar5) {
            bVar5 = SkipFieldValue(this);
            goto LAB_003b41d4;
          }
        }
        bVar5 = SkipFieldMessage(this);
        goto LAB_003b41d4;
      }
    }
LAB_003b41d1:
    bVar5 = false;
  }
  else {
    bVar5 = ConsumeIdentifierBeforeWhitespace(this,(string *)local_f0);
    if (!bVar5) goto LAB_003b41d1;
    (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1b0,message);
    if ((local_170->current_).type == TYPE_WHITESPACE) {
      io::Tokenizer::Next(local_170);
    }
    if ((code *)local_1b0._0_8_ != pcVar21) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if ((this->allow_field_number_ == true) &&
       (bVar5 = safe_strto32((string *)local_f0,(int32 *)&local_d0), bVar5)) {
      pEVar10 = Descriptor::FindExtensionRangeContainingNumber
                          (pDVar13,(int)local_d0._M_dataplus._M_p);
      if (pEVar10 == (ExtensionRange *)0x0) {
        pRVar16 = Descriptor::FindReservedRangeContainingNumber
                            (pDVar13,(int)local_d0._M_dataplus._M_p);
        bVar7 = true;
        if (pRVar16 == (ReservedRange *)0x0) {
          pFVar17 = Descriptor::FindFieldByNumber(pDVar13,(int)local_d0._M_dataplus._M_p);
          goto LAB_003b34eb;
        }
        goto LAB_003b3d94;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        pFVar17 = DescriptorPool::FindExtensionByNumber
                            (*(DescriptorPool **)(*(long *)(pDVar13 + 0x10) + 0x10),pDVar13,
                             (int)local_d0._M_dataplus._M_p);
      }
      else {
        iVar8 = (*pFVar1->_vptr_Finder[3])(pFVar1,pDVar13);
        pFVar17 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar8);
      }
LAB_003b34eb:
      if (pFVar17 != (FieldDescriptor *)0x0) goto LAB_003b34f7;
LAB_003b3580:
      if (*(bool *)((long)this + 0xf5) != false) {
        std::operator+(&local_110,"Message type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(pDVar13 + 8) + 0x20));
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        local_168._0_8_ = local_168 + 0x10;
        pFVar17 = (FieldDescriptor *)(puVar14 + 2);
        if ((FieldDescriptor *)*puVar14 == pFVar17) {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_158._8_8_ = puVar14[3];
        }
        else {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_168._0_8_ = (FieldDescriptor *)*puVar14;
        }
        local_168._8_8_ = puVar14[1];
        *puVar14 = pFVar17;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
        pcVar21 = (code *)(puVar14 + 2);
        if ((code *)*puVar14 == pcVar21) {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar21;
          local_1a0[0]._8_8_ = puVar14[3];
          local_1b0._0_8_ = local_1b0 + 0x10;
        }
        else {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar21;
          local_1b0._0_8_ = (code *)*puVar14;
        }
        local_1b0._8_8_ = puVar14[1];
        *puVar14 = pcVar21;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ReportWarning(this,*(int *)((long)this + 0x50),*(ColumnNumber *)((long)this + 0x54),
                      (string *)local_1b0);
        goto LAB_003b3d48;
      }
      std::operator+(&local_110,"Message type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(pDVar13 + 8) + 0x20));
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_168._0_8_ = local_168 + 0x10;
      pFVar17 = (FieldDescriptor *)(puVar14 + 2);
      if ((FieldDescriptor *)*puVar14 == pFVar17) {
        local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
        local_158._8_8_ = puVar14[3];
      }
      else {
        local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
        local_168._0_8_ = (FieldDescriptor *)*puVar14;
      }
      local_168._8_8_ = puVar14[1];
      *puVar14 = pFVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
      pcVar21 = (code *)(puVar14 + 2);
      if ((code *)*puVar14 == pcVar21) {
        local_1a0[0]._0_8_ = *(undefined8 *)pcVar21;
        local_1a0[0]._8_8_ = puVar14[3];
        local_1b0._0_8_ = local_1b0 + 0x10;
      }
      else {
        local_1a0[0]._0_8_ = *(undefined8 *)pcVar21;
        local_1b0._0_8_ = (code *)*puVar14;
      }
      local_1b0._8_8_ = puVar14[1];
      *puVar14 = pcVar21;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      ReportError(this,*(int *)((long)this + 0x50),*(ColumnNumber *)((long)this + 0x54),
                  (string *)local_1b0);
LAB_003b4187:
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_);
      }
      if ((FieldDescriptor *)local_168._0_8_ != (FieldDescriptor *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_);
      }
      paVar18 = &local_110.field_2;
LAB_003b41c3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar18->_M_allocated_capacity)[-2] != paVar18) {
        operator_delete((undefined1 *)(&paVar18->_M_allocated_capacity)[-2]);
      }
      goto LAB_003b41d1;
    }
    pFVar17 = Descriptor::FindFieldByName(pDVar13,(ConstStringParam)local_f0);
    if (pFVar17 == (FieldDescriptor *)0x0) {
      local_1b0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
      if ((char *)local_1b0._8_8_ != (char *)0x0) {
        pcVar20 = (char *)0x0;
        do {
          if ((byte)((char)*(code *)(local_1b0._0_8_ + (long)pcVar20) + 0xbfU) < 0x1a) {
            *(byte *)(local_1b0._0_8_ + (long)pcVar20) =
                 (byte)*(code *)(local_1b0._0_8_ + (long)pcVar20) | 0x20;
          }
          pcVar20 = pcVar20 + 1;
        } while ((char *)local_1b0._8_8_ != pcVar20);
      }
      pFVar11 = Descriptor::FindFieldByName(pDVar13,(ConstStringParam)local_1b0);
      if (pFVar11 == (FieldDescriptor *)0x0) {
        pFVar17 = (FieldDescriptor *)0x0;
      }
      else {
        if (*(once_flag **)(pFVar11 + 0x18) != (once_flag *)0x0) {
          local_148._0_8_ = FieldDescriptor::TypeOnceInit;
          local_168._0_8_ = pFVar11;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar11 + 0x18),(_func_void_FieldDescriptor_ptr **)local_148,
                     (FieldDescriptor **)local_168);
        }
        pFVar17 = (FieldDescriptor *)0x0;
        if (pFVar11[2] == (FieldDescriptor)0xa) {
          pFVar17 = pFVar11;
        }
      }
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (pFVar17 != (FieldDescriptor *)0x0) goto LAB_003b3237;
LAB_003b32a1:
      if (this->allow_case_insensitive_field_ == true) {
        local_1b0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b0,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
        if ((char *)local_1b0._8_8_ != (char *)0x0) {
          pcVar20 = (char *)0x0;
          do {
            if ((byte)((char)*(code *)(local_1b0._0_8_ + (long)pcVar20) + 0xbfU) < 0x1a) {
              *(byte *)(local_1b0._0_8_ + (long)pcVar20) =
                   (byte)*(code *)(local_1b0._0_8_ + (long)pcVar20) | 0x20;
            }
            pcVar20 = pcVar20 + 1;
          } while ((char *)local_1b0._8_8_ != pcVar20);
        }
        pFVar17 = Descriptor::FindFieldByLowercaseName(pDVar13,(ConstStringParam)local_1b0);
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if (pFVar17 != (FieldDescriptor *)0x0) goto LAB_003b34f7;
      }
      uVar4 = local_f0._8_8_;
      uVar24 = (ulong)*(int *)(pDVar13 + 0x84);
      if (0 < (long)uVar24) {
        lVar2 = *(long *)&pDVar13[0x60].field_0x0;
        local_178 = (Reflection *)local_f0._0_8_;
        bVar5 = true;
        uVar22 = 1;
        local_118 = message;
        local_b0 = (ParseLocation)this;
        local_98 = pDVar13;
        do {
          puVar14 = *(undefined8 **)(lVar2 + uVar22 * 8 + -8);
          if ((uVar4 == puVar14[1]) &&
             ((uVar4 == 0 || (iVar8 = bcmp(local_178,(void *)*puVar14,uVar4), iVar8 == 0)))) break;
          bVar5 = uVar22 < uVar24;
          bVar7 = uVar22 != uVar24;
          uVar22 = uVar22 + 1;
        } while (bVar7);
        bVar7 = true;
        this = (ParserImpl *)local_b0;
        pDVar13 = local_98;
        message = local_118;
        if (bVar5) goto LAB_003b3d94;
      }
      goto LAB_003b3580;
    }
LAB_003b3237:
    if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
      local_1b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_148._0_8_ = pFVar17;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar17 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1b0,
                 (FieldDescriptor **)local_148);
    }
    if (pFVar17[2] == (FieldDescriptor)0xa) {
      pDVar15 = FieldDescriptor::message_type(pFVar17);
      sVar3 = (*(undefined8 **)(pDVar15 + 8))[1];
      if ((sVar3 != local_f0._8_8_) ||
         ((sVar3 != 0 &&
          (iVar8 = bcmp((void *)**(undefined8 **)(pDVar15 + 8),(void *)local_f0._0_8_,sVar3),
          iVar8 != 0)))) goto LAB_003b32a1;
    }
LAB_003b34f7:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      FVar6 = pFVar17[1];
      if ((~(byte)FVar6 & 0x60) != 0) {
        bVar5 = Reflection::HasField(local_178,message,pFVar17);
        if (bVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,"Non-repeated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          plVar12 = (long *)std::__cxx11::string::append(local_148);
          pcVar23 = (code *)(plVar12 + 2);
          if ((code *)*plVar12 == pcVar23) {
            local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
            local_1a0[0]._8_8_ = plVar12[3];
            local_1b0._0_8_ = pcVar21;
          }
          else {
            local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
            local_1b0._0_8_ = (code *)*plVar12;
          }
          local_1b0._8_8_ = plVar12[1];
          *plVar12 = (long)pcVar23;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1b0);
          if ((code *)local_1b0._0_8_ != pcVar21) {
            operator_delete((void *)local_1b0._0_8_);
          }
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_148 + 0x10);
          goto LAB_003b41c3;
        }
        FVar6 = pFVar17[1];
      }
      oneof_descriptor = *(OneofDescriptor **)(pFVar17 + 0x28);
      if ((oneof_descriptor != (OneofDescriptor *)0x0 && ((byte)FVar6 & 0x10) != 0) &&
         (bVar5 = Reflection::HasOneof(local_178,message,oneof_descriptor), bVar5)) {
        pFVar17 = Reflection::GetOneofFieldDescriptor(local_178,message,oneof_descriptor);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"Field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        plVar12 = (long *)std::__cxx11::string::append(local_90);
        psVar19 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_d0.field_2._M_allocated_capacity = *psVar19;
          local_d0.field_2._8_8_ = plVar12[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar19;
          local_d0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_d0._M_string_length = plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::operator+(&local_110,&local_d0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pFVar17 + 8));
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        pFVar17 = (FieldDescriptor *)(puVar14 + 2);
        if ((FieldDescriptor *)*puVar14 == pFVar17) {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_158._8_8_ = puVar14[3];
          local_168._0_8_ = (FieldDescriptor *)(local_168 + 0x10);
        }
        else {
          local_158._M_allocated_capacity = *(undefined8 *)pFVar17;
          local_168._0_8_ = (FieldDescriptor *)*puVar14;
        }
        local_168._8_8_ = puVar14[1];
        *puVar14 = pFVar17;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (oneof_descriptor + 8));
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
        pcVar23 = (code *)(puVar14 + 2);
        if ((code *)*puVar14 == pcVar23) {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
          local_1a0[0]._8_8_ = puVar14[3];
          local_1b0._0_8_ = pcVar21;
        }
        else {
          local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
          local_1b0._0_8_ = (code *)*puVar14;
        }
        local_1b0._8_8_ = puVar14[1];
        *puVar14 = pcVar23;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1b0);
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_);
        }
        if ((FieldDescriptor *)local_168._0_8_ != (FieldDescriptor *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_90 + 0x10);
        goto LAB_003b41c3;
      }
    }
    if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
      local_1b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_148._0_8_ = pFVar17;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar17 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1b0,
                 (FieldDescriptor **)local_148);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar17[2] * 4) == 10) {
      local_1b0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,":","");
      bVar5 = TryConsumeBeforeWhitespace(this,(string *)local_1b0);
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1b0,message);
      if ((local_170->current_).type == TYPE_WHITESPACE) {
        io::Tokenizer::Next(local_170);
      }
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (((!bVar5) || (*(char *)(*(long *)(pFVar17 + 0x38) + 0x4f) != '\x01')) ||
         ((local_170->current_).type != TYPE_STRING)) goto LAB_003b3817;
      local_1b0._8_8_ = (char *)0x0;
      local_1a0[0]._M_allocated_capacity = local_1a0[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_1b0._0_8_ = pcVar21;
      bVar5 = ConsumeString(this,(string *)local_1b0);
      if (bVar5) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          factory = (MessageFactory *)0x0;
        }
        else {
          iVar8 = (*pFVar1->_vptr_Finder[5])(pFVar1,pFVar17);
          factory = (MessageFactory *)CONCAT44(extraout_var_04,iVar8);
        }
        this_00 = &Reflection::MutableMessage(local_178,message,pFVar17,factory)->super_MessageLite;
        MessageLite::ParseFromString(this_00,(ConstStringParam)local_1b0);
      }
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (!bVar5) goto LAB_003b41d1;
    }
    else {
      local_1b0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,":","");
      bVar5 = ConsumeBeforeWhitespace(this,(string *)local_1b0);
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (!bVar5) goto LAB_003b41d1;
      (*(message->super_MessageLite)._vptr_MessageLite[2])(local_1b0,message);
      if ((local_170->current_).type == TYPE_WHITESPACE) {
        io::Tokenizer::Next(local_170);
      }
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
LAB_003b3817:
      if ((~(byte)pFVar17[1] & 0x60) == 0) {
        local_1b0._0_8_ = pcVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[","");
        bVar5 = TryConsume(this,(string *)local_1b0);
        if ((code *)local_1b0._0_8_ != pcVar21) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if (bVar5) {
          local_1b0._0_8_ = pcVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"]","");
          bVar5 = TryConsume(this,(string *)local_1b0);
          if ((code *)local_1b0._0_8_ != pcVar21) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if (!bVar5) {
            do {
              pcVar21 = (code *)(local_1b0 + 0x10);
              if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
                local_1b0._0_8_ = FieldDescriptor::TypeOnceInit;
                local_148._0_8_ = pFVar17;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(pFVar17 + 0x18),
                           (_func_void_FieldDescriptor_ptr **)local_1b0,
                           (FieldDescriptor **)local_148);
              }
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar17[2] * 4) == 10)
              {
                bVar5 = ConsumeFieldMessage(this,message,local_178,pFVar17);
              }
              else {
                bVar5 = ConsumeFieldValue(this,message,local_178,pFVar17);
              }
              if (bVar5 == false) goto LAB_003b41d1;
              local_1b0._0_8_ = pcVar21;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"]","");
              bVar5 = TryConsume(this,(string *)local_1b0);
              if ((code *)local_1b0._0_8_ != pcVar21) {
                operator_delete((void *)local_1b0._0_8_);
              }
              if (bVar5) goto LAB_003b4239;
              local_1b0._0_8_ = pcVar21;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,",","");
              bVar7 = Consume(this,(string *)local_1b0);
              if ((code *)local_1b0._0_8_ != pcVar21) {
                operator_delete((void *)local_1b0._0_8_);
              }
              bVar5 = false;
            } while (bVar7);
            goto LAB_003b41d4;
          }
          goto LAB_003b4239;
        }
      }
      CVar9 = FieldDescriptor::cpp_type(pFVar17);
      if (CVar9 == CPPTYPE_MESSAGE) {
        bVar5 = ConsumeFieldMessage(this,message,local_178,pFVar17);
      }
      else {
        bVar5 = ConsumeFieldValue(this,message,local_178,pFVar17);
      }
      if (bVar5 == false) goto LAB_003b41d1;
    }
LAB_003b4239:
    pcVar21 = (code *)(local_1b0 + 0x10);
    local_1b0._0_8_ = pcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,";","");
    bVar5 = TryConsume(this,(string *)local_1b0);
    if (!bVar5) {
      local_148._0_8_ = (FieldDescriptor *)(local_148 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,",","");
      TryConsume(this,(string *)local_148);
      if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_);
      }
    }
    if ((code *)local_1b0._0_8_ != pcVar21) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if (*(char *)(*(long *)(pFVar17 + 0x38) + 0x4e) == '\x01') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "text format contains deprecated field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      puVar14 = (undefined8 *)std::__cxx11::string::append(local_148);
      pcVar23 = (code *)(puVar14 + 2);
      if ((code *)*puVar14 == pcVar23) {
        local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
        local_1a0[0]._8_8_ = puVar14[3];
        local_1b0._0_8_ = pcVar21;
      }
      else {
        local_1a0[0]._0_8_ = *(undefined8 *)pcVar23;
        local_1b0._0_8_ = (code *)*puVar14;
      }
      local_1b0._8_8_ = puVar14[1];
      *puVar14 = pcVar23;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1b0);
      if ((code *)local_1b0._0_8_ != pcVar21) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if ((FieldDescriptor *)local_148._0_8_ != (FieldDescriptor *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_);
      }
    }
    bVar5 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      range.start = local_b0;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar17,range);
    }
  }
LAB_003b41d4:
  if ((Reflection *)local_f0._0_8_ != (Reflection *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      // ':' is optional between message labels and values.
      TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix_and_full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            prefix_and_full_type_name);
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(message->GetTypeName(), "Extension");

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");

      int32_t field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace(message->GetTypeName(), "Unknown/Reserved");
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }